

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_memory.c
# Opt level: O3

void setPagesRWX(void *ptr,size_t bytes)

{
  mprotect(ptr,bytes,7);
  return;
}

Assistant:

static inline int pageProtect(void* ptr, size_t bytes, int rules, char **errfunc) {
#if defined(_WIN32) || defined(__CYGWIN__)
	DWORD oldp;
	if (!VirtualProtect(ptr, bytes, (DWORD)rules, &oldp)) {
		Fail("VirtualProtect");
	}
#else
	if (-1 == mprotect(ptr, bytes, rules))
		Fail("mprotect");
#endif
	return 0;
}